

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_sort.cc
# Opt level: O3

int main(int argc,char **argv)

{
  char *progname;
  bool bVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  VersionsList versions;
  fstream fs;
  VersionsList local_260;
  istream local_240 [528];
  
  progname = *argv;
  uVar7 = 0;
  bVar1 = false;
  while( true ) {
    do {
      bVar3 = bVar1;
      iVar2 = getopt(argc,argv,"pahvV");
      bVar1 = true;
    } while (iVar2 == 0x76);
    if (iVar2 < 0x61) break;
    if (iVar2 == 0x61) {
      uVar7 = uVar7 | 2;
      bVar1 = bVar3;
    }
    else {
      if (iVar2 == 0x68) goto LAB_00102422;
      if (iVar2 != 0x70) goto LAB_001024cb;
      uVar7 = uVar7 | 1;
      bVar1 = bVar3;
    }
  }
  if (iVar2 == -1) {
    lVar4 = (long)_optind;
    local_260.versions_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_260.versions_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_260.versions_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar6 = argc - _optind;
    local_260.flags_ = uVar7;
    if (uVar6 == 0) {
      VersionsList::Read(&local_260,(istream *)&std::cin);
    }
    if (0 < (int)uVar6) {
      uVar5 = 0;
      do {
        std::fstream::fstream(local_240,argv[lVar4 + uVar5],_S_out|_S_in);
        VersionsList::Read(&local_260,local_240);
        std::fstream::~fstream(local_240);
        uVar5 = uVar5 + 1;
      } while (uVar6 != uVar5);
    }
    VersionsList::Sort(&local_260);
    if (bVar3) {
      VersionsList::VerboseDump(&local_260,(ostream *)&std::cout);
    }
    else {
      VersionsList::Dump(&local_260,(ostream *)&std::cout);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_260.versions_);
    return 0;
  }
  if (iVar2 == 0x3f) {
LAB_00102422:
    print_usage(progname);
    return 0;
  }
  if (iVar2 == 0x56) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"libversion ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"3.0.3",5);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
    return 0;
  }
LAB_001024cb:
  print_usage(progname);
  return 1;
}

Assistant:

int main(int argc, char** argv) {
	int ch, flags = 0;
	const char* progname = argv[0];
	bool verbose = false;

	while ((ch = getopt(argc, argv, "pahvV")) != -1) {
		switch (ch) {
		case 'p':
			flags |= VERSIONFLAG_P_IS_PATCH;
			break;
		case 'a':
			flags |= VERSIONFLAG_ANY_IS_PATCH;
			break;
		case 'h':
		case '?':
			print_usage(progname);
			return 0;
		case 'V':
			print_version();
			return 0;
		case 'v':
			verbose = true;
			break;
		default:
			print_usage(progname);
			return 1;
		}
	}

	argc -= optind;
	argv += optind;

	VersionsList versions(flags);

	if (argc == 0) {
		versions.Read(std::cin);
	}
	for (int arg = 0; arg < argc; ++arg) {
		std::fstream fs(argv[arg]);
		versions.Read(fs);
	}

	versions.Sort();

	if (verbose) {
		versions.VerboseDump(std::cout);
	} else {
		versions.Dump(std::cout);
	}

	return 0;
}